

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap)

{
  undefined8 *puVar1;
  byte bVar2;
  ushort uVar3;
  u32 uVar4;
  ExprList *pEVar5;
  Select *pSVar6;
  SrcList *pSVar7;
  Table *pTab;
  sqlite3 *db;
  Index *pIdx;
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  Vdbe *p;
  Expr *pEVar13;
  Expr *pLeft;
  CollSeq *pCVar14;
  char *zP4;
  char aff2;
  uint isRowid;
  long lVar15;
  int iVar16;
  Index **ppIVar17;
  ExprList_item *pEVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ExprList_item *pEVar23;
  ulong uVar24;
  ulong local_78;
  
  iVar16 = pParse->nTab;
  pParse->nTab = iVar16 + 1;
  p = sqlite3GetVdbe(pParse);
  if (prRhsHasNull == (int *)0x0) {
    prRhsHasNull = (int *)0x0;
  }
  else if ((pX->flags & 0x800) != 0) {
    pEVar5 = ((pX->x).pSelect)->pEList;
    uVar12 = pEVar5->nExpr;
    pEVar23 = pEVar5->a;
    uVar21 = 0;
    uVar24 = 0;
    if (0 < (int)uVar12) {
      uVar24 = (ulong)uVar12;
    }
    for (; uVar24 != uVar21; uVar21 = uVar21 + 1) {
      iVar10 = sqlite3ExprCanBeNull(pEVar23->pExpr);
      if (iVar10 != 0) {
        uVar24 = uVar21 & 0xffffffff;
        break;
      }
      pEVar23 = pEVar23 + 1;
    }
    if ((uint)uVar24 == uVar12) {
      prRhsHasNull = (int *)0x0;
    }
  }
  if ((((((pParse->nErr == 0) && ((pX->flags & 0x820) == 0x800)) &&
        (pSVar6 = (pX->x).pSelect, pSVar6->pPrior == (Select *)0x0)) &&
       (((pSVar6->selFlags & 9) == 0 && (pSVar6->pLimit == (Expr *)0x0)))) &&
      ((pSVar6->pWhere == (Expr *)0x0 &&
       ((pSVar7 = pSVar6->pSrc, pSVar7->nSrc == 1 && (pSVar7->a[0].pSelect == (Select *)0x0)))))) &&
     (pTab = pSVar7->a[0].pTab, pTab->nModuleArg == 0)) {
    uVar12 = pSVar6->pEList->nExpr;
    pEVar23 = pSVar6->pEList->a;
    uVar21 = 0;
    if (0 < (int)uVar12) {
      uVar21 = (ulong)uVar12;
    }
    lVar19 = 0;
LAB_00254c3a:
    if (uVar21 * 0x20 + 0x20 != lVar19 + 0x20) goto code_r0x00254c43;
    db = pParse->db;
    iVar10 = sqlite3SchemaToIndex(db,pTab->pSchema);
    iVar10 = (int)(short)iVar10;
    sqlite3CodeVerifySchema(pParse,iVar10);
    sqlite3TableLock(pParse,iVar10,pTab->tnum,'\0',pTab->zName);
    if ((uVar12 == 1) && (pEVar23->pExpr->iColumn < 0)) {
      iVar20 = sqlite3VdbeAddOp0(p,0x14);
      sqlite3OpenTable(pParse,iVar16,iVar10,pTab,0x68);
      sqlite3VdbeJumpHere(p,iVar20);
      iVar20 = 1;
    }
    else {
      bVar9 = true;
      lVar19 = 0;
      pEVar18 = pEVar23;
      while ((lVar19 < (int)uVar12 && (bVar9))) {
        pEVar13 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)lVar19);
        lVar15 = (long)pEVar18->pExpr->iColumn;
        if (lVar15 < 0) {
          aff2 = 'D';
        }
        else {
          aff2 = pTab->aCol[lVar15].affinity;
        }
        cVar8 = sqlite3CompareAffinity(pEVar13,aff2);
        bVar9 = 'B' < aff2 || (byte)(cVar8 + 0xbfU) < 2;
        lVar19 = lVar19 + 1;
        pEVar18 = pEVar18 + 1;
      }
      if (!bVar9) goto LAB_00254fa7;
      ppIVar17 = &pTab->pIndex;
      iVar20 = 0;
      while ((pIdx = *ppIVar17, pIdx != (Index *)0x0 && (iVar20 == 0))) {
        uVar3 = pIdx->nColumn;
        if (((uVar3 < 0x3f) && ((int)uVar12 <= (int)(uint)uVar3)) &&
           (((inFlags & 4) == 0 ||
            (((int)(uint)pIdx->nKeyCol <= (int)uVar12 &&
             ((uVar3 <= uVar12 || (pIdx->onError != '\0')))))))) {
          iVar20 = 0;
          local_78 = 0;
          for (uVar24 = 0; uVar24 != uVar21; uVar24 = uVar24 + 1) {
            pLeft = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar24);
            pEVar13 = pEVar23[uVar24].pExpr;
            pCVar14 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar13);
            uVar22 = 0;
            while( true ) {
              if (uVar12 == uVar22) goto LAB_00254e91;
              if ((pIdx->aiColumn[uVar22] == pEVar13->iColumn) &&
                 ((pCVar14 == (CollSeq *)0x0 ||
                  (iVar11 = sqlite3StrICmp(pCVar14->zName,pIdx->azColl[uVar22]), iVar11 == 0))))
              break;
              uVar22 = uVar22 + 1;
            }
            if ((uVar12 == (uint)uVar22) || ((local_78 >> (uVar22 & 0x3f) & 1) != 0)) break;
            if (aiMap != (int *)0x0) {
              aiMap[uVar24] = (uint)uVar22;
            }
            local_78 = local_78 | 1L << ((byte)uVar22 & 0x3f);
          }
LAB_00254e91:
          if ((local_78 ^ -1L << ((byte)uVar12 & 0x3f)) == 0xffffffffffffffff) {
            iVar11 = sqlite3VdbeAddOp0(p,0x14);
            zP4 = sqlite3MPrintf(db,"USING INDEX %s FOR IN-OPERATOR",pIdx->zName);
            sqlite3VdbeAddOp4(p,0xa7,0,0,0,zP4,-7);
            sqlite3VdbeAddOp3(p,0x68,iVar16,pIdx->tnum,iVar10);
            sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
            bVar2 = *pIdx->aSortOrder;
            if (prRhsHasNull != (int *)0x0) {
              iVar20 = pParse->nMem + 1;
              pParse->nMem = iVar20;
              *prRhsHasNull = iVar20;
              if (uVar12 == 1) {
                sqlite3SetHasNullFlag(p,iVar16,iVar20);
              }
            }
            iVar20 = bVar2 + 3;
            sqlite3VdbeJumpHere(p,iVar11);
          }
        }
        else {
          iVar20 = 0;
        }
        ppIVar17 = &pIdx->pNext;
      }
      if (iVar20 == 0) goto LAB_00254fa7;
    }
    goto LAB_00254fea;
  }
LAB_00254fa7:
  if (((inFlags & 1) != 0) && ((pX->flags & 0x800) == 0)) {
    pEVar13 = pX->pLeft;
    pX->pLeft = (Expr *)0x0;
    iVar10 = sqlite3ExprIsConstant(pX);
    pX->pLeft = pEVar13;
    iVar20 = 5;
    if ((iVar10 == 0) || (((pX->x).pList)->nExpr < 3)) {
LAB_00254fea:
      pX->iTable = iVar16;
      goto LAB_00255070;
    }
  }
  uVar4 = pParse->nQueryLoop;
  if ((inFlags & 4) == 0) {
    iVar20 = 2;
    isRowid = 0;
    if (prRhsHasNull == (int *)0x0) {
      iVar16 = 0;
    }
    else {
      iVar16 = pParse->nMem + 1;
      pParse->nMem = iVar16;
      *prRhsHasNull = iVar16;
    }
  }
  else {
    pParse->nQueryLoop = 0;
    iVar16 = 0;
    if (pX->pLeft->iColumn < 0) {
      uVar12 = pX->flags & 0x800;
      isRowid = uVar12 >> 0xb ^ 1;
      iVar20 = 2 - (uint)(uVar12 == 0);
    }
    else {
      iVar20 = 2;
      isRowid = 0;
    }
  }
  sqlite3CodeSubselect(pParse,pX,iVar16,isRowid);
  pParse->nQueryLoop = uVar4;
LAB_00255070:
  if ((aiMap != (int *)0x0) && (iVar20 - 5U < 0xfffffffe)) {
    uVar12 = sqlite3ExprVectorSize(pX->pLeft);
    uVar24 = 0;
    uVar21 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar21 = uVar24;
    }
    for (; uVar21 != uVar24; uVar24 = uVar24 + 1) {
      aiMap[uVar24] = (int)uVar24;
    }
  }
  return iVar20;
code_r0x00254c43:
  puVar1 = (undefined8 *)((long)&pEVar23->pExpr + lVar19);
  lVar19 = lVar19 + 0x20;
  if (*(char *)*puVar1 != -0x68) goto LAB_00254fa7;
  goto LAB_00254c3a;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The right-hand side (RHS) of the IN operator */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap                 /* Mapping from Index fields to RHS fields */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters 
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due 
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && (pX->flags & EP_xIsSelect) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    i16 iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;

      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each 
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }
  
          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;
  
            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }
  
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
#ifndef SQLITE_OMIT_EXPLAIN
            sqlite3VdbeAddOp4(v, OP_Explain, 0, 0, 0,
              sqlite3MPrintf(db, "USING INDEX %s FOR IN-OPERATOR",pIdx->zName),
              P4_DYNAMIC);
#endif
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];
  
            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, 
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
      if( pX->pLeft->iColumn<0 && !ExprHasProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  return eType;
}